

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

string * __thiscall
relive::formattedDate_abi_cxx11_(string *__return_storage_ptr__,relive *this,int64_t unixTimestamp)

{
  relive *local_30;
  time_t t;
  tm *ti;
  relive *local_18;
  int64_t unixTimestamp_local;
  string *result;
  
  ti._7_1_ = 0;
  local_18 = this;
  unixTimestamp_local = (int64_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  t = 0;
  local_30 = local_18;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  t = (time_t)localtime((time_t *)&local_30);
  anon_unknown.dwarf_265168::append2Digits(__return_storage_ptr__,((tm *)t)->tm_year / 100 + 0x13);
  anon_unknown.dwarf_265168::append2Digits(__return_storage_ptr__,*(int *)(t + 0x14) % 100);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'-');
  anon_unknown.dwarf_265168::append2Digits(__return_storage_ptr__,*(int *)(t + 0x10) + 1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'-');
  anon_unknown.dwarf_265168::append2Digits(__return_storage_ptr__,*(uint *)(t + 0xc));
  return __return_storage_ptr__;
}

Assistant:

std::string formattedDate(int64_t unixTimestamp)
{
    std::string result;
    struct std::tm* ti = nullptr;
    std::time_t t = unixTimestamp;
    result.reserve(9);
    ti = localtime (&t);
    append2Digits(result, 19+ti->tm_year/100);
    append2Digits(result, ti->tm_year%100);
    result += '-';
    append2Digits(result, ti->tm_mon+1);
    result += '-';
    append2Digits(result, ti->tm_mday);
    return result;
}